

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O3

bool __thiscall QTreeViewPrivate::isItemHiddenOrDisabled(QTreeViewPrivate *this,int i)

{
  QTreeViewItem *pQVar1;
  Data *pDVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  QAbstractItemModel *pQVar3;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Bucket BVar7;
  QModelIndex local_58;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((i < 0) || (uVar5 = (ulong)(uint)i, (ulong)(this->viewItems).d.size <= uVar5)) {
    bVar6 = false;
  }
  else {
    pQVar1 = (this->viewItems).d.ptr;
    local_58.m.ptr = pQVar1[uVar5].index.m.ptr;
    pQVar1 = pQVar1 + uVar5;
    local_58.r = (pQVar1->index).r;
    local_58.c = (pQVar1->index).c;
    local_58.i = (pQVar1->index).i;
    pDVar2 = (this->hiddenIndexes).q_hash.d;
    if (((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) &&
       (this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90),
       local_38._0_8_ = local_58._0_8_, local_38.i = local_58.i, local_38.m.ptr = local_58.m.ptr,
       this_00 !=
       (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *
       )0x0)) {
      BVar7 = QHashPrivate::
              Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              ::findBucket<QtPrivate::QModelIndexWrapper>(this_00,(QModelIndexWrapper *)&local_38);
      if ((BVar7.span[BVar7.index] != (Span)0xff) && (*(long *)(BVar7.span + 0x80) != 0)) {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_38,&local_58);
        this_01 = (this->hiddenIndexes).q_hash.d;
        if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_38);
        }
        else {
          pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                   findNode<QPersistentModelIndex>(this_01,(QPersistentModelIndex *)&local_38);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_38);
          bVar6 = true;
          if (pNVar4 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_005a9fb7;
        }
      }
    }
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    uVar5 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_58);
    bVar6 = (uVar5 & 0x20) == 0;
  }
LAB_005a9fb7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

inline bool isItemHiddenOrDisabled(int i) const {
        if (i < 0 || i >= viewItems.size())
            return false;
        const QModelIndex index = viewItems.at(i).index;
        return isRowHidden(index) || !isIndexEnabled(index);
    }